

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O3

void __thiscall json::string::string(string *this,string *other)

{
  (this->super_value)._vptr_value = (_func_int **)&PTR__string_0019fb98;
  (this->_data)._M_dataplus._M_p = (pointer)&(this->_data).field_2;
  (this->_data)._M_string_length = 0;
  (this->_data).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->_data);
  return;
}

Assistant:

json::string::string (const std::string& other)
{
  _data = other;
}